

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

CURLcode Curl_client_chop_write(connectdata *conn,int type,char *ptr,size_t len)

{
  SessionHandle *data_00;
  CURLcode CVar1;
  size_t sVar2;
  char *pcVar3;
  SessionHandle *pSVar4;
  SessionHandle *local_80;
  curl_write_callback local_78;
  size_t wrote_1;
  size_t wrote;
  size_t chunklen;
  char *newptr;
  size_t newlen;
  curl_write_callback writebody;
  curl_write_callback writeheader;
  SessionHandle *data;
  size_t len_local;
  char *ptr_local;
  int type_local;
  connectdata *conn_local;
  
  data_00 = conn->data;
  writebody = (curl_write_callback)0x0;
  newlen = 0;
  if (len == 0) {
    conn_local._4_4_ = CURLE_OK;
  }
  else if (((data_00->req).keepon & 0x10U) == 0) {
    if ((type & 1U) != 0) {
      newlen = (size_t)(data_00->set).fwrite_func;
    }
    data = (SessionHandle *)len;
    len_local = (size_t)ptr;
    if (((type & 2U) != 0) &&
       (((data_00->set).fwrite_header != (curl_write_callback)0x0 ||
        ((data_00->set).writeheader != (void *)0x0)))) {
      if ((data_00->set).fwrite_header == (curl_write_callback)0x0) {
        local_78 = (data_00->set).fwrite_func;
      }
      else {
        local_78 = (data_00->set).fwrite_header;
      }
      writebody = local_78;
    }
    for (; data != (SessionHandle *)0x0; data = (SessionHandle *)((long)data - (long)local_80)) {
      if (data < (SessionHandle *)0x4001) {
        local_80 = data;
      }
      else {
        local_80 = (SessionHandle *)0x4000;
      }
      if (newlen != 0) {
        pSVar4 = (SessionHandle *)(*(code *)newlen)(len_local,1,local_80,(data_00->set).out);
        if (pSVar4 == (SessionHandle *)0x10000001) {
          if ((conn->handler->flags & 0x10) != 0) {
            Curl_failf(data_00,"Write callback asked for PAUSE when not supported!");
            return CURLE_WRITE_ERROR;
          }
          CVar1 = pausewrite(data_00,type,(char *)len_local,(size_t)data);
          return CVar1;
        }
        if (pSVar4 != local_80) {
          Curl_failf(data_00,"Failed writing body (%zu != %zu)",pSVar4,local_80);
          return CURLE_WRITE_ERROR;
        }
      }
      if (writebody != (curl_write_callback)0x0) {
        pSVar4 = (SessionHandle *)
                 (*writebody)((char *)len_local,1,(size_t)local_80,(data_00->set).writeheader);
        if (pSVar4 == (SessionHandle *)0x10000001) {
          CVar1 = pausewrite(data_00,2,(char *)len_local,(size_t)data);
          return CVar1;
        }
        if (pSVar4 != local_80) {
          Curl_failf(data_00,"Failed writing header");
          return CURLE_WRITE_ERROR;
        }
      }
      len_local = (long)local_80->sockets + (len_local - 0x38);
    }
    conn_local._4_4_ = CURLE_OK;
  }
  else if (type == (data_00->state).tempwritetype) {
    sVar2 = len + (data_00->state).tempwritesize;
    pcVar3 = (char *)(*Curl_crealloc)((data_00->state).tempwrite,sVar2);
    if (pcVar3 == (char *)0x0) {
      conn_local._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      memcpy(pcVar3 + (data_00->state).tempwritesize,ptr,len);
      (data_00->state).tempwrite = pcVar3;
      (data_00->state).tempwritesize = sVar2;
      conn_local._4_4_ = CURLE_OK;
    }
  }
  else {
    conn_local._4_4_ = CURLE_RECV_ERROR;
  }
  return conn_local._4_4_;
}

Assistant:

CURLcode Curl_client_chop_write(struct connectdata *conn,
                                int type,
                                char * ptr,
                                size_t len)
{
  struct SessionHandle *data = conn->data;
  curl_write_callback writeheader = NULL;
  curl_write_callback writebody = NULL;

  if(!len)
    return CURLE_OK;

  /* If reading is actually paused, we're forced to append this chunk of data
     to the already held data, but only if it is the same type as otherwise it
     can't work and it'll return error instead. */
  if(data->req.keepon & KEEP_RECV_PAUSE) {
    size_t newlen;
    char *newptr;
    if(type != data->state.tempwritetype)
      /* major internal confusion */
      return CURLE_RECV_ERROR;

    DEBUGASSERT(data->state.tempwrite);

    /* figure out the new size of the data to save */
    newlen = len + data->state.tempwritesize;
    /* allocate the new memory area */
    newptr = realloc(data->state.tempwrite, newlen);
    if(!newptr)
      return CURLE_OUT_OF_MEMORY;
    /* copy the new data to the end of the new area */
    memcpy(newptr + data->state.tempwritesize, ptr, len);
    /* update the pointer and the size */
    data->state.tempwrite = newptr;
    data->state.tempwritesize = newlen;
    return CURLE_OK;
  }

  /* Determine the callback(s) to use. */
  if(type & CLIENTWRITE_BODY)
    writebody = data->set.fwrite_func;
  if((type & CLIENTWRITE_HEADER) &&
     (data->set.fwrite_header || data->set.writeheader)) {
    /*
     * Write headers to the same callback or to the especially setup
     * header callback function (added after version 7.7.1).
     */
    writeheader =
      data->set.fwrite_header? data->set.fwrite_header: data->set.fwrite_func;
  }

  /* Chop data, write chunks. */
  while(len) {
    size_t chunklen = len <= CURL_MAX_WRITE_SIZE? len: CURL_MAX_WRITE_SIZE;

    if(writebody) {
      size_t wrote = writebody(ptr, 1, chunklen, data->set.out);

      if(CURL_WRITEFUNC_PAUSE == wrote) {
        if(conn->handler->flags & PROTOPT_NONETWORK) {
          /* Protocols that work without network cannot be paused. This is
             actually only FILE:// just now, and it can't pause since the
             transfer isn't done using the "normal" procedure. */
          failf(data, "Write callback asked for PAUSE when not supported!");
          return CURLE_WRITE_ERROR;
        }
        else
          return pausewrite(data, type, ptr, len);
      }
      else if(wrote != chunklen) {
        failf(data, "Failed writing body (%zu != %zu)", wrote, chunklen);
        return CURLE_WRITE_ERROR;
      }
    }

    if(writeheader) {
      size_t wrote = writeheader(ptr, 1, chunklen, data->set.writeheader);

      if(CURL_WRITEFUNC_PAUSE == wrote)
        /* here we pass in the HEADER bit only since if this was body as well
           then it was passed already and clearly that didn't trigger the
           pause, so this is saved for later with the HEADER bit only */
        return pausewrite(data, CLIENTWRITE_HEADER, ptr, len);

      if(wrote != chunklen) {
        failf (data, "Failed writing header");
        return CURLE_WRITE_ERROR;
      }
    }

    ptr += chunklen;
    len -= chunklen;
  }

  return CURLE_OK;
}